

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O2

void __thiscall ASDCP::MXF::GenericTrack::Dump(GenericTrack *this,FILE *stream)

{
  char *pcVar1;
  char identbuf [128];
  char local_98 [128];
  
  local_98[0] = '\0';
  if (stream == (FILE *)0x0) {
    stream = (FILE *)_stderr;
  }
  InterchangeObject::Dump(&this->super_InterchangeObject,stream);
  fprintf((FILE *)stream,"  %22s = %d\n","TrackID",(ulong)this->TrackID);
  fprintf((FILE *)stream,"  %22s = %d\n","TrackNumber",(ulong)this->TrackNumber);
  if ((this->TrackName).m_has_value == true) {
    pcVar1 = UTF16String::EncodeString(&(this->TrackName).m_property,local_98,0x80);
    fprintf((FILE *)stream,"  %22s = %s\n","TrackName",pcVar1);
  }
  if ((this->Sequence).m_has_value == true) {
    pcVar1 = Kumu::UUID::EncodeString(&(this->Sequence).m_property,local_98,0x80);
    fprintf((FILE *)stream,"  %22s = %s\n","Sequence",pcVar1);
  }
  return;
}

Assistant:

void
GenericTrack::Dump(FILE* stream)
{
  char identbuf[IdentBufferLen];
  *identbuf = 0;

  if ( stream == 0 )
    stream = stderr;

  InterchangeObject::Dump(stream);
  fprintf(stream, "  %22s = %d\n",  "TrackID", TrackID);
  fprintf(stream, "  %22s = %d\n",  "TrackNumber", TrackNumber);
  if ( ! TrackName.empty() ) {
    fprintf(stream, "  %22s = %s\n",  "TrackName", TrackName.get().EncodeString(identbuf, IdentBufferLen));
  }
  if ( ! Sequence.empty() ) {
    fprintf(stream, "  %22s = %s\n",  "Sequence", Sequence.get().EncodeString(identbuf, IdentBufferLen));
  }
}